

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O0

int ARKodeSetUserData(void *arkode_mem,void *user_data)

{
  undefined8 in_RSI;
  long in_RDI;
  ARKodeMem ark_mem;
  int local_4;
  
  if (in_RDI == 0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0x357,"ARKodeSetUserData",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                    ,"arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    *(undefined8 *)(in_RDI + 0x10) = in_RSI;
    if (*(int *)(in_RDI + 0x54) != 0) {
      *(undefined8 *)(in_RDI + 0x60) = in_RSI;
    }
    if (*(int *)(in_RDI + 0x68) != 0) {
      *(undefined8 *)(in_RDI + 0x78) = in_RSI;
    }
    if (*(long *)(in_RDI + 0x3a0) != 0) {
      *(undefined8 *)(*(long *)(in_RDI + 0x3a0) + 0x80) = in_RSI;
    }
    if (*(long *)(in_RDI + 0x3b8) != 0) {
      *(undefined8 *)(in_RDI + 0x3c0) = in_RSI;
    }
    if (*(long *)(in_RDI + 0xa8) == 0) {
      local_4 = 0;
    }
    else {
      local_4 = (**(code **)(in_RDI + 0xa8))(in_RDI,in_RSI);
    }
  }
  return local_4;
}

Assistant:

int ARKodeSetUserData(void* arkode_mem, void* user_data)
{
  ARKodeMem ark_mem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem            = (ARKodeMem)arkode_mem;
  ark_mem->user_data = user_data;

  /* Set data for efun */
  if (ark_mem->user_efun) { ark_mem->e_data = user_data; }

  /* Set data for rfun */
  if (ark_mem->user_rfun) { ark_mem->r_data = user_data; }

  /* Set data for root finding */
  if (ark_mem->root_mem != NULL) { ark_mem->root_mem->root_data = user_data; }

  /* Set data for post-processing a step */
  if (ark_mem->ProcessStep != NULL) { ark_mem->ps_data = user_data; }

  /* Set user data into stepper (if provided) */
  if (ark_mem->step_setuserdata)
  {
    return (ark_mem->step_setuserdata(arkode_mem, user_data));
  }

  return (ARK_SUCCESS);
}